

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O0

void setMarks(void)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  ostream *poVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_128;
  int local_10c;
  double local_108 [4];
  iterator local_e8;
  undefined8 local_e0;
  double local_d8 [4];
  iterator local_b8;
  undefined8 local_b0;
  double local_a8 [5];
  iterator local_80;
  undefined8 local_78;
  allocator<double> local_59;
  double local_58 [5];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<double,_std::allocator<double>_> temp;
  
  local_58[2] = 3.0;
  local_58[3] = 2.0;
  local_58[0] = 1.0;
  local_58[1] = 4.0;
  local_30 = local_58;
  local_28 = 4;
  std::allocator<double>::allocator(&local_59);
  __l_02._M_len = local_28;
  __l_02._M_array = local_30;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_20,__l_02,&local_59);
  std::allocator<double>::~allocator(&local_59);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,(value_type *)local_20);
  local_a8[2] = 5.0;
  local_a8[3] = 6.0;
  local_a8[0] = 4.0;
  local_a8[1] = 2.0;
  local_80 = local_a8;
  local_78 = 4;
  __l_01._M_len = 4;
  __l_01._M_array = local_80;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_20,__l_01);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,(value_type *)local_20);
  local_d8[2] = 4.0;
  local_d8[3] = 5.0;
  local_d8[0] = 3.0;
  local_d8[1] = 8.0;
  local_b8 = local_d8;
  local_b0 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_b8;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_20,__l_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,(value_type *)local_20);
  local_108[2] = 7.0;
  local_108[3] = 8.0;
  local_108[0] = 9.0;
  local_108[1] = 5.0;
  local_e8 = local_108;
  local_e0 = 4;
  __l._M_len = 4;
  __l._M_array = local_e8;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_20,__l);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,(value_type *)local_20);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_10c = (int)std::setw(10);
  poVar1 = std::operator<<(poVar1,(_Setw)local_10c);
  poVar1 = std::operator<<(poVar1,"MATRIX ASSESSMENTS");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_128,&marks);
  printMatrix(&local_128);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_128);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_20);
  return;
}

Assistant:

void setMarks(){
    //Suzuki
    vector<double> temp={1,4,3,2};
    marks.push_back(temp);
    //Mitsubishi
    temp={4,2,5,6};
    marks.push_back(temp);
    //Honda
    temp={3,8,4,5};
    marks.push_back(temp);
    //Toyota
    temp={9,5,7,8};
    marks.push_back(temp);

    cout << endl << setw(10) << "MATRIX ASSESSMENTS" << endl;
    printMatrix(marks);
}